

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O3

void density_tests::detail::
     sp_queues_generic_tests<(density::concurrency_cardinality)1,(density::concurrency_cardinality)0>
               (QueueTesterFlags i_flags,ostream *i_output,EasyRandom *i_random,
               size_t i_element_count,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *i_nonblocking_thread_counts)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  if ((i_flags & eUseTestAllocators) == eNone) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_a8,i_nonblocking_thread_counts);
    single_lf_queue_generic_test<density::sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>>
              (i_flags,i_output,i_random,i_element_count,&local_a8);
  }
  else {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_48,i_nonblocking_thread_counts);
    single_lf_queue_generic_test<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>>
              (i_flags,i_output,i_random,i_element_count,&local_48);
    if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_60,i_nonblocking_thread_counts);
    single_lf_queue_generic_test<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>>
              (i_flags,i_output,i_random,i_element_count,&local_60);
    if (local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_78,i_nonblocking_thread_counts);
    single_lf_queue_generic_test<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>>
              (i_flags,i_output,i_random,i_element_count,&local_78);
    if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_90,i_nonblocking_thread_counts);
    single_lf_queue_generic_test<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>>
              (i_flags,i_output,i_random,i_element_count,&local_90);
    local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void sp_queues_generic_tests(
          QueueTesterFlags            i_flags,
          std::ostream &              i_output,
          EasyRandom &                i_random,
          size_t                      i_element_count,
          std::vector<size_t> const & i_nonblocking_thread_counts)
        {
            using namespace density;

            if (i_flags && QueueTesterFlags::eUseTestAllocators)
            {
                single_lf_queue_generic_test<sp_heter_queue<
                  runtime_type<>,
                  UnmovableFastTestAllocator<>,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>>(
                  i_flags, i_output, i_random, i_element_count, i_nonblocking_thread_counts);

                single_lf_queue_generic_test<sp_heter_queue<
                  TestRuntimeTime<>,
                  DeepTestAllocator<>,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>>(
                  i_flags, i_output, i_random, i_element_count, i_nonblocking_thread_counts);

                single_lf_queue_generic_test<sp_heter_queue<
                  runtime_type<>,
                  UnmovableFastTestAllocator<256>,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>>(
                  i_flags, i_output, i_random, i_element_count, i_nonblocking_thread_counts);

                single_lf_queue_generic_test<sp_heter_queue<
                  TestRuntimeTime<>,
                  DeepTestAllocator<256>,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>>(
                  i_flags, i_output, i_random, i_element_count, i_nonblocking_thread_counts);
            }
            else
            {
                single_lf_queue_generic_test<sp_heter_queue<
                  runtime_type<>,
                  default_allocator,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>>(
                  i_flags, i_output, i_random, i_element_count, i_nonblocking_thread_counts);
            }
        }